

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O1

lu_mem checkgraylist(global_State *g,GCObject *o)

{
  byte bVar1;
  lu_mem lVar2;
  long lVar3;
  
  lVar2 = 0;
  if (o != (GCObject *)0x0) {
    do {
      bVar1 = o->marked;
      if (((bVar1 & 7) == 6) == ((bVar1 & 0x38) == 0)) {
        __assert_fail("!!(!(((o)->marked) & (((1<<(3)) | (1<<(4))) | (1<<(5))))) ^ (((o)->marked & 7) == 6)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1b3,"lu_mem checkgraylist(global_State *, GCObject *)");
      }
      if ((char)bVar1 < '\0') {
        __assert_fail("!((o->marked) & ((1<<(7))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1b4,"lu_mem checkgraylist(global_State *, GCObject *)");
      }
      if (g->gcstate < 3) {
        o->marked = bVar1 | 0x80;
      }
      switch(o->tt) {
      case '\x05':
        lVar3 = 0x30;
        break;
      case '\a':
switchD_0014b049_caseD_7:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1be,"lu_mem checkgraylist(global_State *, GCObject *)");
      case '\b':
        lVar3 = 0x48;
        break;
      case '\t':
        lVar3 = 0x70;
        break;
      default:
        if (o->tt != '&') goto switchD_0014b049_caseD_7;
      case '\x06':
        lVar3 = 0x10;
      }
      o = *(GCObject **)((long)&o->next + lVar3);
      lVar2 = lVar2 + 1;
    } while (o != (GCObject *)0x0);
  }
  return lVar2;
}

Assistant:

static lu_mem checkgraylist (global_State *g, GCObject *o) {
  int total = 0;  /* count number of elements in the list */
  ((void)g);  /* better to keep it available if we need to print an object */
  while (o) {
    lua_assert(!!isgray(o) ^ (getage(o) == G_TOUCHED2));
    lua_assert(!testbit(o->marked, TESTBIT));
    if (keepinvariant(g))
      l_setbit(o->marked, TESTBIT);  /* mark that object is in a gray list */
    total++;
    switch (o->tt) {
      case LUA_TTABLE: o = gco2t(o)->gclist; break;
      case LUA_TLCL: o = gco2lcl(o)->gclist; break;
      case LUA_TCCL: o = gco2ccl(o)->gclist; break;
      case LUA_TTHREAD: o = gco2th(o)->gclist; break;
      case LUA_TPROTO: o = gco2p(o)->gclist; break;
      default: lua_assert(0);  /* other objects cannot be gray */
    }
  }
  return total;
}